

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gi.c
# Opt level: O2

void golf_gi_start_lightmap(golf_gi_t *gi,golf_lightmap_image_t *lightmap_image)

{
  float fVar1;
  _Bool _Var2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  
  if (gi->has_cur_entity == false) {
    fVar1 = lightmap_image->time_length;
    _Var2 = lightmap_image->repeats;
    iVar3 = lightmap_image->num_samples;
    iVar4 = lightmap_image->height;
    gi->has_cur_entity = true;
    iVar5 = lightmap_image->resolution;
    iVar6 = lightmap_image->width;
    (gi->cur_entity).positions.data = (vec3 *)0x0;
    (gi->cur_entity).positions.length = 0;
    (gi->cur_entity).positions.capacity = 0;
    (gi->cur_entity).positions.alloc_category = "gi";
    (gi->cur_entity).normals.data = (vec3 *)0x0;
    (gi->cur_entity).normals.length = 0;
    (gi->cur_entity).normals.capacity = 0;
    (gi->cur_entity).normals.alloc_category = "gi";
    (gi->cur_entity).lightmap_uvs.data = (vec2 *)0x0;
    (gi->cur_entity).lightmap_uvs.length = 0;
    (gi->cur_entity).lightmap_uvs.capacity = 0;
    (gi->cur_entity).lightmap_uvs.alloc_category = "gi";
    (gi->cur_entity).ignore.data = (vec2 *)0x0;
    (gi->cur_entity).ignore.length = 0;
    (gi->cur_entity).ignore.capacity = 0;
    (gi->cur_entity).ignore.alloc_category = "gi";
    (gi->cur_entity).resolution = iVar5;
    (gi->cur_entity).image_width = iVar6;
    (gi->cur_entity).image_height = iVar4;
    (gi->cur_entity).time_length = fVar1;
    (gi->cur_entity).repeats = _Var2;
    (gi->cur_entity).num_samples = iVar3;
    (gi->cur_entity).lightmap_image = lightmap_image;
    (gi->cur_entity).gi_lightmap_sections.data = (golf_gi_lightmap_section_t *)0x0;
    (gi->cur_entity).gi_lightmap_sections.length = 0;
    (gi->cur_entity).gi_lightmap_sections.capacity = 0;
    (gi->cur_entity).gi_lightmap_sections.alloc_category = "gi";
  }
  return;
}

Assistant:

void golf_gi_start_lightmap(golf_gi_t *gi, golf_lightmap_image_t *lightmap_image) {
    if (gi->has_cur_entity) {
        return;
    }

    golf_gi_entity_t entity;
    vec_init(&entity.positions, "gi");
    vec_init(&entity.normals, "gi");
    vec_init(&entity.lightmap_uvs, "gi");
    vec_init(&entity.ignore, "gi");
    vec_init(&entity.gi_lightmap_sections, "gi");

    entity.time_length = lightmap_image->time_length;
    entity.repeats = lightmap_image->repeats;
    entity.num_samples = lightmap_image->num_samples;
    entity.resolution = lightmap_image->resolution;
    entity.image_width = lightmap_image->width;
    entity.image_height = lightmap_image->height;
    entity.lightmap_image = lightmap_image;

    gi->has_cur_entity = true;
    gi->cur_entity = entity;
}